

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O1

void __thiscall duckdb::ByteStreamSplitDecoder::InitializePage(ByteStreamSplitDecoder *this)

{
  uint64_t *puVar1;
  _Head_base<0UL,_duckdb::BssDecoder_*,_false> _Var2;
  uint64_t uVar3;
  ResizeableBuffer *pRVar4;
  ResizeableBuffer *pRVar5;
  _Head_base<0UL,_duckdb::BssDecoder_*,_false> _Var6;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_00;
  
  this_00 = &this->reader->block;
  pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  uVar3 = (pRVar5->super_ByteBuffer).len;
  _Var6._M_head_impl = (BssDecoder *)operator_new(0x18);
  ((_Var6._M_head_impl)->buffer_).ptr = (pRVar4->super_ByteBuffer).ptr;
  *(ulong *)((long)&(_Var6._M_head_impl)->buffer_ + 8) = (ulong)((int)uVar3 - 1);
  (_Var6._M_head_impl)->value_offset_ = 0;
  _Var2._M_head_impl =
       (this->bss_decoder).
       super_unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BssDecoder_*,_std::default_delete<duckdb::BssDecoder>_>.
       super__Head_base<0UL,_duckdb::BssDecoder_*,_false>._M_head_impl;
  (this->bss_decoder).super_unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>
  ._M_t.super___uniq_ptr_impl<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BssDecoder_*,_std::default_delete<duckdb::BssDecoder>_>.
  super__Head_base<0UL,_duckdb::BssDecoder_*,_false>._M_head_impl = _Var6._M_head_impl;
  if (_Var2._M_head_impl != (BssDecoder *)0x0) {
    operator_delete(_Var2._M_head_impl);
  }
  pRVar4 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  uVar3 = (pRVar5->super_ByteBuffer).len;
  ByteBuffer::available(&pRVar4->super_ByteBuffer,uVar3);
  puVar1 = &(pRVar4->super_ByteBuffer).len;
  *puVar1 = *puVar1 - uVar3;
  (pRVar4->super_ByteBuffer).ptr = (pRVar4->super_ByteBuffer).ptr + uVar3;
  return;
}

Assistant:

void ByteStreamSplitDecoder::InitializePage() {
	auto &block = reader.block;
	// Subtract 1 from length as the block is allocated with 1 extra byte,
	// but the byte stream split encoder needs to know the correct data size.
	bss_decoder = make_uniq<BssDecoder>(block->ptr, block->len - 1);
	block->inc(block->len);
}